

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O0

string * __thiscall Shell::TermAlgebra::getSubtermPredicateName_abi_cxx11_(TermAlgebra *this)

{
  Term *this_00;
  Symbol *this_01;
  Signature *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_00000020;
  char *in_stack_00000028;
  undefined8 uVar1;
  Signature *this_02;
  uint n;
  
  uVar1 = DAT_01333830;
  this_02 = in_RDI;
  this_00 = Kernel::TermList::term((TermList *)0xd0f154);
  n = (uint)((ulong)uVar1 >> 0x20);
  Kernel::Term::functor(this_00);
  this_01 = Kernel::Signature::getTypeCon(this_02,n);
  Kernel::Signature::Symbol::name_abi_cxx11_(this_01);
  std::operator+(in_stack_00000028,in_stack_00000020);
  return (string *)in_RDI;
}

Assistant:

std::string TermAlgebra::getSubtermPredicateName() {
  return "$subterm" + env.signature->getTypeCon(_sort.term()->functor())->name();
}